

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_identifier.c
# Opt level: O2

char * mpt_log_identifier(int type)

{
  uint uVar1;
  
  if (0 < type) {
    uVar1 = type & 0x1f;
    if ((type & 0x20U) == 0) {
      if (0xf < uVar1) {
        return "debug";
      }
      if (7 < uVar1) {
        return "info";
      }
      if (3 < uVar1) {
        return "warning";
      }
      if (uVar1 == 3) {
        return "error";
      }
      if (1 < uVar1) {
        return "critical";
      }
      if (uVar1 != 0) {
        return "fatal";
      }
    }
    else {
      if (0xf < uVar1) {
        return "DEBUG";
      }
      if (7 < uVar1) {
        return "INFO";
      }
      if (3 < uVar1) {
        return "WARNING";
      }
      if (uVar1 == 3) {
        return "ERROR";
      }
      if (1 < uVar1) {
        return "CRITICAL";
      }
      if (uVar1 != 0) {
        return "FATAL";
      }
    }
  }
  return (char *)0x0;
}

Assistant:

extern const char *mpt_log_identifier(int type)
{
	if (type <= 0) {
		return 0;
	}
	if (type & MPT_LOG(File)) {
		type &= 0x1f;
		if (type >= MPT_LOG(Debug))    return "DEBUG";
		if (type >= MPT_LOG(Info))     return "INFO";
		if (type >= MPT_LOG(Warning))  return "WARNING";
		if (type >= MPT_LOG(Error))    return "ERROR";
		if (type >= MPT_LOG(Critical)) return "CRITICAL";
		if (type >= MPT_LOG(Fatal))    return "FATAL";
	} else {
		type &= 0x1f;
		if (type >= MPT_LOG(Debug))    return "debug";
		if (type >= MPT_LOG(Info))     return "info";
		if (type >= MPT_LOG(Warning))  return "warning";
		if (type >= MPT_LOG(Error))    return "error";
		if (type >= MPT_LOG(Critical)) return "critical";
		if (type >= MPT_LOG(Fatal))    return "fatal";
	}
	return 0;
}